

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_filename.c
# Opt level: O1

void test_read_format_cpio_filename(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  char *pcVar4;
  archive *paVar5;
  int64_t iVar6;
  archive_entry *ae;
  archive_entry *local_38;
  
  extract_reference_file("test_read_format_cpio_filename_eucjp.cpio");
  pcVar4 = setlocale(6,"en_US.UTF-8");
  if (pcVar4 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'(');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L',',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'-',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar5
                       );
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'.',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar5
                       );
    wVar2 = archive_read_set_options(paVar5,"hdrcharset=eucJP");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar5,"test_read_format_cpio_filename_eucjp.cpio",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'5',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar5);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'8',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5
                         );
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L':',anon_var_dwarf_778e3 + 0x36,"\"\\xe6\\xbc\\xa2\\xe5\\xad\\x97.txt\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L';',8,"8",iVar6,"archive_entry_size(ae)",(void *)0x0);
      wVar2 = archive_entry_is_encrypted(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'<',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'=',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar5);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'@',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5
                         );
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'A',anon_var_dwarf_55e5c + 0x10,"\"\\xe8\\xa1\\xa8.txt\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'B',4,"4",iVar6,"archive_entry_size(ae)",(void *)0x0);
      wVar2 = archive_entry_is_encrypted(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'C',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'D',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar5);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'H',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      iVar1 = archive_filter_code(paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'K',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar5);
      iVar1 = archive_format(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'L',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)",
                          paVar5);
      iVar1 = archive_read_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'O',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'0');
      test_skipping("This system cannot convert character-set from eucJP to UTF-8.");
    }
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Q',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar4 = setlocale(6,"Japanese_Japan");
  if ((pcVar4 == (char *)0x0) && (pcVar4 = setlocale(6,"ja_JP.SJIS"), pcVar4 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'ȣ');
    test_skipping("CP932 locale not available on this system.");
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'ȧ',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Ȩ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar5);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ȩ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar5);
    wVar2 = archive_read_set_options(paVar5,"hdrcharset=eucJP");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar5,"test_read_format_cpio_filename_eucjp.cpio",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ȱ',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar5);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ȳ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'ȴ',anon_var_dwarf_77a54 + 0x2a,"\"\\x8a\\xbf\\x8e\\x9a.txt\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ȵ',8,"8",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ȸ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'ȹ',anon_var_dwarf_9d84d + 0xb,"\"\\x95\\x5c.txt\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ⱥ',4,"4",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ⱦ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      iVar1 = archive_filter_code(paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ɂ',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar5);
      iVar1 = archive_format(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ɂ',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)"
                          ,paVar5);
      iVar1 = archive_read_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ʌ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'ȫ');
      test_skipping("This system cannot convert character-set from eucJP.");
    }
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ɇ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  extract_reference_file("test_read_format_cpio_filename_utf8_jp.cpio");
  pcVar4 = setlocale(6,"ja_JP.eucJP");
  if (pcVar4 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'^');
    test_skipping("ja_JP.eucJP locale not available on this system.");
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'a',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'b',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar5
                       );
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'c',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar5
                       );
    wVar2 = archive_read_set_options(paVar5,"hdrcharset=UTF-8");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename
                        (paVar5,"test_read_format_cpio_filename_utf8_jp.cpio",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'k',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar5);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'n',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5
                         );
      mVar3 = archive_entry_filetype(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'o',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                          (void *)0x0);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'p',anon_var_dwarf_55cb6 + 7,"\"\\xb4\\xc1\\xbb\\xfa.txt\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'q',8,"8",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L't',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5
                         );
      mVar3 = archive_entry_filetype(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'u',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                          (void *)0x0);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'v',anon_var_dwarf_55d70 + 0xb,"\"\\xc9\\xbd.txt\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'w',4,"4",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'{',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      iVar1 = archive_filter_code(paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'~',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar5);
      iVar1 = archive_format(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'\x7f',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,
                          "archive_format(a)",paVar5);
      iVar1 = archive_read_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'\x82',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'e');
      test_skipping("This system cannot convert character-set from UTF-8 to eucJP.");
    }
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'\x84',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar4 = setlocale(6,"en_US.UTF-8");
  if (pcVar4 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'\x91');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'\x95',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'\x96',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar5);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'\x97',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar5);
    wVar2 = archive_read_open_filename(paVar5,"test_read_format_cpio_filename_utf8_jp.cpio",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'\x99',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",paVar5);
    iVar1 = archive_read_next_header(paVar5,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'\x9c',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                        paVar5);
    mVar3 = archive_entry_filetype(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'\x9d',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
               ,L'\x9f',anon_var_dwarf_778e3 + 0x36,"\"\\xe6\\xbc\\xa2\\xe5\\xad\\x97.txt\"",pcVar4,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar6 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'\xa0',8,"8",iVar6,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'£',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5)
    ;
    mVar3 = archive_entry_filetype(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'¤',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                        (void *)0x0);
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
               ,L'¥',anon_var_dwarf_55e5c + 0x10,"\"\\xe8\\xa1\\xa8.txt\"",pcVar4,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar6 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'¦',4,"4",iVar6,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ª',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5
                       );
    iVar1 = archive_filter_code(paVar5,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'­',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                        paVar5);
    iVar1 = archive_format(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'®',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)",
                        paVar5);
    iVar1 = archive_read_close(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'±',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'²',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar4 = setlocale(6,"Japanese_Japan");
  if ((pcVar4 == (char *)0x0) && (pcVar4 = setlocale(6,"ja_JP.SJIS"), pcVar4 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'ɕ');
    test_skipping("CP932 locale not available on this system.");
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'ə',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ɚ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar5);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ɛ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar5);
    wVar2 = archive_read_set_options(paVar5,"hdrcharset=UTF-8");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename
                        (paVar5,"test_read_format_cpio_filename_utf8_jp.cpio",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ɢ',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar5);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ɥ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      mVar3 = archive_entry_filetype(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ɦ',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                          (void *)0x0);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'ɧ',anon_var_dwarf_77a54 + 0x2a,"\"\\x8a\\xbf\\x8e\\x9a.txt\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ɨ',8,"8",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ɫ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      mVar3 = archive_entry_filetype(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ɬ',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                          (void *)0x0);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'ɭ',anon_var_dwarf_9d84d + 0xb,"\"\\x95\\x5c.txt\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ɮ',4,"4",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ɱ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      iVar1 = archive_filter_code(paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ɴ',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar5);
      iVar1 = archive_format(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ɵ',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)"
                          ,paVar5);
      iVar1 = archive_read_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ɸ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'ɝ');
      test_skipping("This system cannot convert character-set from UTF-8 to CP932.");
    }
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ɺ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  extract_reference_file("test_read_format_cpio_filename_cp866.cpio");
  pcVar4 = setlocale(6,"Russian_Russia.20866");
  if ((pcVar4 == (char *)0x0) && (pcVar4 = setlocale(6,"ru_RU.KOI8-R"), pcVar4 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'À');
    test_skipping("ru_RU.KOI8-R locale not available on this system.");
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'Ä',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Å',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar5);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Æ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar5);
    wVar2 = archive_read_set_options(paVar5,"hdrcharset=CP866");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar5,"test_read_format_cpio_filename_cp866.cpio",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Í',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar5);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ð',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'Ò',anon_var_dwarf_59e32,"\"\\xf0\\xf2\\xe9\\xf7\\xe5\\xf4\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ó',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ö',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'Ø',anon_var_dwarf_59e50,"\"\\xd0\\xd2\\xc9\\xd7\\xc5\\xd4\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ù',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ý',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      iVar1 = archive_filter_code(paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'à',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar5);
      iVar1 = archive_format(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'á',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)"
                          ,paVar5);
      iVar1 = archive_read_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ä',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'È');
      test_skipping("This system cannot convert character-set from CP866 to KOI8-R.");
    }
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'æ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar4 = setlocale(6,"en_US.UTF-8");
  if (pcVar4 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'ó');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'÷',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ø',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar5);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ù',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar5);
    wVar2 = archive_read_set_options(paVar5,"hdrcharset=CP866");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar5,"test_read_format_cpio_filename_cp866.cpio",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ā',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar5);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ă',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'ą',anon_var_dwarf_59e6e,
                 "\"\\xd0\\x9f\\xd0\\xa0\\xd0\\x98\\xd0\\x92\\xd0\\x95\\xd0\\xa2\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ć',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ĉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'ċ',anon_var_dwarf_59e90,
                 "\"\\xd0\\xbf\\xd1\\x80\\xd0\\xb8\\xd0\\xb2\\xd0\\xb5\\xd1\\x82\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Č',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Đ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      iVar1 = archive_filter_code(paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ē',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar5);
      iVar1 = archive_format(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ĕ',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)"
                          ,paVar5);
      iVar1 = archive_read_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ė',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'û');
      test_skipping("This system cannot convert character-set from CP866 to UTF-8.");
    }
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ę',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar4 = setlocale(6,"Russian_Russia");
  if ((pcVar4 == (char *)0x0) && (pcVar4 = setlocale(6,"ru_RU.CP1251"), pcVar4 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'ʈ');
    test_skipping("CP1251 locale not available on this system.");
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'ʌ',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ʍ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar5);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ʎ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar5);
    wVar2 = archive_read_set_options(paVar5,"hdrcharset=CP866");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar5,"test_read_format_cpio_filename_cp866.cpio",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ʕ',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar5);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ʘ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'ʚ',anon_var_dwarf_59ed2,"\"\\xcf\\xd0\\xc8\\xc2\\xc5\\xd2\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ʛ',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ʞ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'ʠ',anon_var_dwarf_59ee8,"\"\\xef\\xf0\\xe8\\xe2\\xe5\\xf2\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ʡ',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ʥ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      iVar1 = archive_filter_code(paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ʨ',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar5);
      iVar1 = archive_format(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ʩ',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)"
                          ,paVar5);
      iVar1 = archive_read_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ʬ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'ʐ');
      test_skipping("This system cannot convert character-set from CP866 to CP1251.");
    }
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ʮ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar4 = setlocale(6,"Russian_Russia");
  if (pcVar4 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'ˁ');
    test_skipping("Russian_Russia locale not available on this system.");
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'˅',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ˆ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar5);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ˇ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar5);
    wVar2 = archive_read_open_filename(paVar5,"test_read_format_cpio_filename_cp866.cpio",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ˉ',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",paVar5);
    iVar1 = archive_read_next_header(paVar5,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ˌ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5)
    ;
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
               ,L'ˎ',anon_var_dwarf_59ed2,"\"\\xcf\\xd0\\xc8\\xc2\\xc5\\xd2\"",pcVar4,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar6 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ˏ',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'˒',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5)
    ;
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
               ,L'˔',anon_var_dwarf_59ee8,"\"\\xef\\xf0\\xe8\\xe2\\xe5\\xf2\"",pcVar4,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar6 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'˕',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'˙',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5
                       );
    iVar1 = archive_filter_code(paVar5,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'˜',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                        paVar5);
    iVar1 = archive_format(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'˝',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)",
                        paVar5);
    iVar1 = archive_read_close(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ˠ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ˡ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  extract_reference_file("test_read_format_cpio_filename_koi8r.cpio");
  pcVar4 = setlocale(6,"Russian_Russia.866");
  if ((pcVar4 == (char *)0x0) && (pcVar4 = setlocale(6,"ru_RU.CP866"), pcVar4 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'ħ');
    test_skipping("ru_RU.CP866 locale not available on this system.");
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'ī',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Ĭ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar5);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ĭ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar5);
    wVar2 = archive_read_set_options(paVar5,"hdrcharset=KOI8-R");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar5,"test_read_format_cpio_filename_koi8r.cpio",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ĵ',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar5);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ķ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'Ĺ',anon_var_dwarf_59f4c,"\"\\x8f\\x90\\x88\\x82\\x85\\x92\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ĺ',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ľ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'Ŀ',anon_var_dwarf_59f62,"\"\\xaf\\xe0\\xa8\\xa2\\xa5\\xe2\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ŀ',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ń',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      iVar1 = archive_filter_code(paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ň',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar5);
      iVar1 = archive_format(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ň',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)"
                          ,paVar5);
      iVar1 = archive_read_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ŋ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'į');
      test_skipping("This system cannot convert character-set from KOI8-R to CP866.");
    }
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ō',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar4 = setlocale(6,"en_US.UTF-8");
  if (pcVar4 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'Ś');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'Ş',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ş',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar5);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Š',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar5);
    wVar2 = archive_read_set_options(paVar5,"hdrcharset=KOI8-R");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar5,"test_read_format_cpio_filename_koi8r.cpio",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ŧ',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar5);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ū',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'Ŭ',anon_var_dwarf_59e6e,
                 "\"\\xd0\\x9f\\xd0\\xa0\\xd0\\x98\\xd0\\x92\\xd0\\x95\\xd0\\xa2\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ŭ',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ű',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'Ų',anon_var_dwarf_59e90,
                 "\"\\xd0\\xbf\\xd1\\x80\\xd0\\xb8\\xd0\\xb2\\xd0\\xb5\\xd1\\x82\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ų',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ŷ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      iVar1 = archive_filter_code(paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ź',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar5);
      iVar1 = archive_format(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ż',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)"
                          ,paVar5);
      iVar1 = archive_read_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ž',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'Ţ');
      test_skipping("This system cannot convert character-set from KOI8-R to UTF-8.");
    }
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ƀ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar4 = setlocale(6,"Russian_Russia");
  if ((pcVar4 == (char *)0x0) && (pcVar4 = setlocale(6,"ru_RU.CP1251"), pcVar4 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'˯');
    test_skipping("CP1251 locale not available on this system.");
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'˳',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'˴',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar5);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'˵',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar5);
    wVar2 = archive_read_set_options(paVar5,"hdrcharset=KOI8-R");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar5,"test_read_format_cpio_filename_koi8r.cpio",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'˼',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar5);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'˿',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'́',anon_var_dwarf_59ed2,"\"\\xcf\\xd0\\xc8\\xc2\\xc5\\xd2\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'̂',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'̅',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'̇',anon_var_dwarf_59ee8,"\"\\xef\\xf0\\xe8\\xe2\\xe5\\xf2\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'̈',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'̌',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      iVar1 = archive_filter_code(paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'̏',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar5);
      iVar1 = archive_format(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'̐',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)"
                          ,paVar5);
      iVar1 = archive_read_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'̓',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'˷');
      test_skipping("This system cannot convert character-set from KOI8-R to CP1251.");
    }
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'̕',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  extract_reference_file("test_read_format_cpio_filename_utf8_ru.cpio");
  pcVar4 = setlocale(6,"Russian_Russia.20866");
  if ((pcVar4 == (char *)0x0) && (pcVar4 = setlocale(6,"ru_RU.KOI8-R"), pcVar4 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'Ǝ');
    test_skipping("ru_RU.KOI8-R locale not available on this system.");
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'ƒ',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Ɠ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar5);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Ɣ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar5);
    wVar2 = archive_read_set_options(paVar5,"hdrcharset=UTF-8");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename
                        (paVar5,"test_read_format_cpio_filename_utf8_ru.cpio",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ƛ',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar5);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ƞ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'Ơ',anon_var_dwarf_59e32,"\"\\xf0\\xf2\\xe9\\xf7\\xe5\\xf4\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ơ',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ƥ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'Ʀ',anon_var_dwarf_59e50,"\"\\xd0\\xd2\\xc9\\xd7\\xc5\\xd4\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ƨ',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ƫ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      iVar1 = archive_filter_code(paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ʈ',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar5);
      iVar1 = archive_format(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ư',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)"
                          ,paVar5);
      iVar1 = archive_read_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ʋ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'Ɩ');
      test_skipping("This system cannot convert character-set from UTF-8 to KOI8-R.");
    }
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ƴ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar4 = setlocale(6,"Russian_Russia.866");
  if ((pcVar4 == (char *)0x0) && (pcVar4 = setlocale(6,"ru_RU.CP866"), pcVar4 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'ǂ');
    test_skipping("ru_RU.CP866 locale not available on this system.");
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'ǆ',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Ǉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar5);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ǈ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar5);
    wVar2 = archive_read_set_options(paVar5,"hdrcharset=UTF-8");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename
                        (paVar5,"test_read_format_cpio_filename_utf8_ru.cpio",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ǐ',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar5);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ǒ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'ǔ',anon_var_dwarf_59f4c,"\"\\x8f\\x90\\x88\\x82\\x85\\x92\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ǖ',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ǘ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      pcVar4 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                 ,L'ǚ',anon_var_dwarf_59f62,"\"\\xaf\\xe0\\xa8\\xa2\\xa5\\xe2\"",pcVar4,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar6 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ǜ',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ǟ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      iVar1 = archive_filter_code(paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ǣ',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar5);
      iVar1 = archive_format(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'ǣ',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)"
                          ,paVar5);
      iVar1 = archive_read_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                          ,L'Ǧ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'Ǌ');
      test_skipping("This system cannot convert character-set from UTF-8 to CP866.");
    }
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Ǩ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar4 = setlocale(6,"en_US.UTF-8");
  if (pcVar4 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'ǵ');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                     ,L'ǹ',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Ǻ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar5);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ǻ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar5);
    wVar2 = archive_read_open_filename(paVar5,"test_read_format_cpio_filename_utf8_ru.cpio",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ǽ',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",paVar5);
    iVar1 = archive_read_next_header(paVar5,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Ȁ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5)
    ;
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
               ,L'Ȃ',anon_var_dwarf_59e6e,
               "\"\\xd0\\x9f\\xd0\\xa0\\xd0\\x98\\xd0\\x92\\xd0\\x95\\xd0\\xa2\"",pcVar4,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar6 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ȃ',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Ȇ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5)
    ;
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
               ,L'Ȉ',anon_var_dwarf_59e90,
               "\"\\xd0\\xbf\\xd1\\x80\\xd0\\xb8\\xd0\\xb2\\xd0\\xb5\\xd1\\x82\"",pcVar4,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar6 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ȉ',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ȍ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5
                       );
    iVar1 = archive_filter_code(paVar5,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Ȑ',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                        paVar5);
    iVar1 = archive_format(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ȑ',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)",
                        paVar5);
    iVar1 = archive_read_close(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'Ȕ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'ȕ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar4 = setlocale(6,"Russian_Russia");
  if ((pcVar4 == (char *)0x0) && (pcVar4 = setlocale(6,"ru_RU.CP1251"), pcVar4 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'̣');
    test_skipping("CP1251 locale not available on this system.");
    return;
  }
  paVar5 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'̧',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                      ,L'̨',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar5)
  ;
  iVar1 = archive_read_support_format_all(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                      ,L'̩',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar5)
  ;
  wVar2 = archive_read_set_options(paVar5,"hdrcharset=UTF-8");
  if (wVar2 == L'\0') {
    wVar2 = archive_read_open_filename(paVar5,"test_read_format_cpio_filename_utf8_ru.cpio",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'̰',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",paVar5);
    iVar1 = archive_read_next_header(paVar5,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'̳',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5)
    ;
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
               ,L'̵',anon_var_dwarf_59ed2,"\"\\xcf\\xd0\\xc8\\xc2\\xc5\\xd2\"",pcVar4,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar6 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'̶',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'̹',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5)
    ;
    pcVar4 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
               ,L'̻',anon_var_dwarf_59ee8,"\"\\xef\\xf0\\xe8\\xe2\\xe5\\xf2\"",pcVar4,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar6 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'̼',6,"6",iVar6,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'̀',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5
                       );
    iVar1 = archive_filter_code(paVar5,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'̓',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",
                        paVar5);
    iVar1 = archive_format(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'̈́',0x10001,"ARCHIVE_FORMAT_CPIO_POSIX",(long)iVar1,"archive_format(a)",
                        paVar5);
    iVar1 = archive_read_close(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                        ,L'͇',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                   ,L'̫');
    test_skipping("This system cannot convert character-set from UTF-8 to CP1251.");
  }
  iVar1 = archive_read_free(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_filename.c"
                      ,L'͉',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_filename)
{
	const char *refname1 = "test_read_format_cpio_filename_eucjp.cpio";
	const char *refname2 = "test_read_format_cpio_filename_utf8_jp.cpio";
	const char *refname3 = "test_read_format_cpio_filename_cp866.cpio";
	const char *refname4 = "test_read_format_cpio_filename_koi8r.cpio";
	const char *refname5 = "test_read_format_cpio_filename_utf8_ru.cpio";

	extract_reference_file(refname1);
	test_read_format_cpio_filename_eucJP_UTF8(refname1);
	test_read_format_cpio_filename_eucJP_CP932(refname1);

	extract_reference_file(refname2);
	test_read_format_cpio_filename_UTF8_eucJP(refname2);
	test_read_format_cpio_filename_UTF8_UTF8_jp(refname2);
	test_read_format_cpio_filename_UTF8_CP932(refname2);

	extract_reference_file(refname3);
	test_read_format_cpio_filename_CP866_KOI8R(refname3);
	test_read_format_cpio_filename_CP866_UTF8(refname3);
	test_read_format_cpio_filename_CP866_CP1251(refname3);
	test_read_format_cpio_filename_CP866_CP1251_win(refname3);

	extract_reference_file(refname4);
	test_read_format_cpio_filename_KOI8R_CP866(refname4);
	test_read_format_cpio_filename_KOI8R_UTF8(refname4);
	test_read_format_cpio_filename_KOI8R_CP1251(refname4);

	extract_reference_file(refname5);
	test_read_format_cpio_filename_UTF8_KOI8R(refname5);
	test_read_format_cpio_filename_UTF8_CP866(refname5);
	test_read_format_cpio_filename_UTF8_UTF8_ru(refname5);
	test_read_format_cpio_filename_UTF8_CP1251(refname5);
}